

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eln.c
# Opt level: O3

LineInfo * el_line(EditLine *el)

{
  byte *pbVar1;
  LineInfo *pLVar2;
  el_zfunc_t p_Var3;
  LineInfoW *pLVar4;
  char *pcVar5;
  size_t sVar6;
  wchar_t *pwVar7;
  long lVar8;
  
  pLVar4 = el_wline(el);
  pLVar2 = &el->el_lgcylinfo;
  if (((uint)el->el_flags >> 9 & 1) == 0) {
    el->el_flags = el->el_flags | 0x200;
    pcVar5 = ct_encode_string(pLVar4->buffer,&el->el_lgcyconv);
    (el->el_lgcylinfo).buffer = pcVar5;
    pwVar7 = pLVar4->buffer;
    if (pwVar7 < pLVar4->cursor) {
      lVar8 = 0;
      do {
        sVar6 = ct_enc_width(*pwVar7);
        lVar8 = lVar8 + sVar6;
        pwVar7 = pwVar7 + 1;
      } while (pwVar7 < pLVar4->cursor);
      pcVar5 = pLVar2->buffer;
      pwVar7 = pLVar4->buffer;
    }
    else {
      lVar8 = 0;
    }
    (el->el_lgcylinfo).cursor = pcVar5 + lVar8;
    if (pwVar7 < pLVar4->lastchar) {
      lVar8 = 0;
      do {
        sVar6 = ct_enc_width(*pwVar7);
        lVar8 = lVar8 + sVar6;
        pwVar7 = pwVar7 + 1;
      } while (pwVar7 < pLVar4->lastchar);
      pcVar5 = pLVar2->buffer;
    }
    else {
      lVar8 = 0;
    }
    (el->el_lgcylinfo).lastchar = pcVar5 + lVar8;
    p_Var3 = (el->el_chared).c_resizefun;
    if (p_Var3 != (el_zfunc_t)0x0) {
      (*p_Var3)(el,(el->el_chared).c_resizearg);
    }
    pbVar1 = (byte *)((long)&el->el_flags + 1);
    *pbVar1 = *pbVar1 & 0xfd;
  }
  return pLVar2;
}

Assistant:

const LineInfo *
el_line(EditLine *el)
{
	const LineInfoW *winfo = el_wline(el);
	LineInfo *info = &el->el_lgcylinfo;
	size_t offset;
	const wchar_t *p;

	if (el->el_flags & FROM_ELLINE)
		return info;

	el->el_flags |= FROM_ELLINE;
	info->buffer   = ct_encode_string(winfo->buffer, &el->el_lgcyconv);

	offset = 0;
	for (p = winfo->buffer; p < winfo->cursor; p++)
		offset += ct_enc_width(*p);
	info->cursor = info->buffer + offset;

	offset = 0;
	for (p = winfo->buffer; p < winfo->lastchar; p++)
		offset += ct_enc_width(*p);
	info->lastchar = info->buffer + offset;

	if (el->el_chared.c_resizefun)  
		(*el->el_chared.c_resizefun)(el, el->el_chared.c_resizearg);
	el->el_flags &= ~FROM_ELLINE;

	return info;
}